

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  uint uVar1;
  int *piVar2;
  ulong __new_size;
  bool bVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  
  iVar4 = this->size_;
  if (-1 < iVar4) {
    uVar1 = this->max_size_;
    if ((int)uVar1 < iVar4) {
LAB_0012b441:
      __assert_fail("(size_) <= (max_size_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x1c5,
                    "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                   );
    }
    piVar2 = this->sparse_to_dense_;
    if (piVar2 != (int *)0x0 || iVar4 == 0) {
      __new_size = (ulong)(uint)new_max_size;
      if ((int)uVar1 < new_max_size) {
        piVar5 = (int *)operator_new__(__new_size * 4);
        if (piVar2 != (int *)0x0) {
          memmove(piVar5,piVar2,(ulong)uVar1 << 2);
          operator_delete__(piVar2);
        }
        this->sparse_to_dense_ = piVar5;
        std::
        vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
        ::resize(&this->dense_,__new_size);
        bVar3 = RunningOnValgrind();
        if ((bVar3) && (uVar6 = (ulong)this->max_size_, this->max_size_ < new_max_size)) {
          piVar2 = this->sparse_to_dense_;
          piVar5 = &(this->dense_).
                    super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].index_;
          do {
            piVar2[uVar6] = -0x54545455;
            *piVar5 = -0x54545455;
            uVar6 = uVar6 + 1;
            piVar5 = piVar5 + 4;
          } while (__new_size != uVar6);
        }
      }
      this->max_size_ = new_max_size;
      iVar4 = this->size_;
      if (new_max_size < this->size_) {
        this->size_ = new_max_size;
        iVar4 = new_max_size;
      }
      if (iVar4 < 0) goto LAB_0012b422;
      if (new_max_size < iVar4) goto LAB_0012b441;
      if ((iVar4 == 0) || (this->sparse_to_dense_ != (int *)0x0)) {
        return;
      }
    }
    __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c6,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
LAB_0012b422:
  __assert_fail("(0) <= (size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1c4,
                "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
               );
}

Assistant:

void SparseArray<Value>::DebugCheckInvariants() const {
  DCHECK_LE(0, size_);
  DCHECK_LE(size_, max_size_);
  DCHECK(size_ == 0 || sparse_to_dense_ != NULL);
}